

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putcontig8bitYCbCr21tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t b_2;
  uint32_t g_2;
  uint32_t r_2;
  int32_t Cr_1;
  int32_t Cb_1;
  uint32_t b_1;
  uint32_t g_1;
  uint32_t r_1;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  int32_t Cr;
  int32_t Cb;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  Cr = h;
  Cb = w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  do {
    for (w_local = (uint)Cb >> 1; w_local != 0; w_local = w_local - 1) {
      r = (uint32_t)pp[2];
      g = (uint32_t)pp[3];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r,g,&b,&r_1,&g_1);
      *_y_local = b | r_1 << 8 | g_1 << 0x10 | 0xff000000;
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)pp[1],r,g,&b_1,(uint32_t *)&Cb_1,
                     (uint32_t *)&Cr_1);
      _y_local[1] = b_1 | Cb_1 << 8 | Cr_1 << 0x10 | 0xff000000;
      _y_local = _y_local + 2;
      pp = pp + 4;
    }
    if ((Cb & 1U) != 0) {
      r_2 = (uint32_t)pp[2];
      g_2 = (uint32_t)pp[3];
      TIFFYCbCrtoRGB(*(TIFFYCbCrToRGB **)(cp_local + 0x1a),(uint)*pp,r_2,g_2,&b_2,&local_58,
                     &local_5c);
      *_y_local = b_2 | local_58 << 8 | local_5c << 0x10 | 0xff000000;
      _y_local = _y_local + 1;
      pp = pp + 4;
    }
    _y_local = _y_local + toskew;
    pp = pp + (fromskew / 2 << 2);
    Cr = Cr + -1;
  } while (Cr != 0);
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr21tile)
{
    (void)y;
    fromskew = (fromskew / 2) * (2 * 1 + 2);
    do
    {
        x = w >> 1;
        while (x > 0)
        {
            int32_t Cb = pp[2];
            int32_t Cr = pp[3];

            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);

            cp += 2;
            pp += 4;
            x--;
        }

        if ((w & 1) != 0)
        {
            int32_t Cb = pp[2];
            int32_t Cr = pp[3];

            YCbCrtoRGB(cp[0], pp[0]);

            cp += 1;
            pp += 4;
        }

        cp += toskew;
        pp += fromskew;
    } while (--h);
}